

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SnippetFunction(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                        sqlite3_value **apVal)

{
  int n;
  int iVar1;
  uchar *aSeen_00;
  bool bVar2;
  int local_120;
  int local_11c;
  int local_118;
  int jj;
  int nScore;
  int iAdj;
  int io;
  int ic;
  int ip;
  int ii;
  int nDocsize;
  int nDoc;
  char *zErr;
  undefined4 local_e8;
  int nCol;
  Fts5SFinder sFinder;
  int nColSize;
  int nBestScore;
  int iBestStart;
  int iBestCol;
  uchar *aSeen;
  int nPhrase;
  int i;
  int nInst;
  int nToken;
  char *zEllips;
  int iCol;
  int rc;
  HighlightContext ctx;
  sqlite3_value **apVal_local;
  int nVal_local;
  sqlite3_context *pCtx_local;
  Fts5Context *pFts_local;
  Fts5ExtensionApi *pApi_local;
  
  zEllips._4_4_ = 0;
  nPhrase = 0;
  nColSize = 0;
  sFinder.zDoc._4_4_ = 0;
  sFinder.zDoc._0_4_ = 0;
  ctx.zOut = (char *)apVal;
  if (nVal == 5) {
    zErr._4_4_ = (*pApi->xColumnCount)(pFts);
    memset(&iCol,0,0x60);
    zEllips._0_4_ = sqlite3_value_int(*(sqlite3_value **)ctx.zOut);
    ctx._48_8_ = fts5ValueToText(*(sqlite3_value **)(ctx.zOut + 8));
    ctx.zOpen = fts5ValueToText(*(sqlite3_value **)(ctx.zOut + 0x10));
    _nInst = fts5ValueToText(*(sqlite3_value **)(ctx.zOut + 0x18));
    i = sqlite3_value_int(*(sqlite3_value **)(ctx.zOut + 0x20));
    if ((int)zEllips < 0) {
      local_120 = 0;
    }
    else {
      local_120 = (int)zEllips;
    }
    nBestScore = local_120;
    n = (*pApi->xPhraseCount)(pFts);
    aSeen_00 = (uchar *)sqlite3_malloc(n);
    if (aSeen_00 == (uchar *)0x0) {
      zEllips._4_4_ = 7;
    }
    if (zEllips._4_4_ == 0) {
      zEllips._4_4_ = (*pApi->xInstCount)(pFts,&nPhrase);
    }
    memset(&local_e8,0,0x20);
    for (aSeen._4_4_ = 0; aSeen._4_4_ < zErr._4_4_; aSeen._4_4_ = aSeen._4_4_ + 1) {
      if (((int)zEllips < 0) || ((int)zEllips == aSeen._4_4_)) {
        local_e8 = 0;
        sFinder.iPos = 0;
        zEllips._4_4_ = (*pApi->xColumnText)(pFts,aSeen._4_4_,(char **)&sFinder.aFirst,&ii);
        if ((zEllips._4_4_ != 0) ||
           ((zEllips._4_4_ =
                  (*pApi->xTokenize)(pFts,(char *)sFinder.aFirst,ii,&local_e8,fts5SentenceFinderCb),
            zEllips._4_4_ != 0 ||
            (zEllips._4_4_ = (*pApi->xColumnSize)(pFts,aSeen._4_4_,&ip), zEllips._4_4_ != 0))))
        break;
        for (ic = 0; zEllips._4_4_ == 0 && ic < nPhrase; ic = ic + 1) {
          zEllips._4_4_ = (*pApi->xInst)(pFts,ic,&io,&iAdj,&nScore);
          if (iAdj == aSeen._4_4_) {
            if (ip < nScore) {
              zEllips._4_4_ = 0x10b;
            }
            if (zEllips._4_4_ == 0) {
              memset(aSeen_00,0,(long)n);
              zEllips._4_4_ =
                   fts5SnippetScore(pApi,pFts,ip,aSeen_00,aSeen._4_4_,nScore,i,&local_118,&jj);
              if ((zEllips._4_4_ == 0) && (sFinder.zDoc._4_4_ < local_118)) {
                sFinder.zDoc._4_4_ = local_118;
                nBestScore = aSeen._4_4_;
                nColSize = jj;
                sFinder.zDoc._0_4_ = ip;
              }
              if (((zEllips._4_4_ == 0) && (sFinder.iPos != 0)) && (i < ip)) {
                local_11c = 0;
                while ((local_11c < sFinder.iPos + -1 &&
                       (*(int *)(sFinder._8_8_ + (long)(local_11c + 1) * 4) <= nScore))) {
                  local_11c = local_11c + 1;
                }
                if (*(int *)(sFinder._8_8_ + (long)local_11c * 4) < nScore) {
                  memset(aSeen_00,0,(long)n);
                  zEllips._4_4_ =
                       fts5SnippetScore(pApi,pFts,ip,aSeen_00,aSeen._4_4_,
                                        *(int *)(sFinder._8_8_ + (long)local_11c * 4),i,&local_118,
                                        (int *)0x0);
                  iVar1 = 100;
                  if (*(int *)(sFinder._8_8_ + (long)local_11c * 4) == 0) {
                    iVar1 = 0x78;
                  }
                  local_118 = iVar1 + local_118;
                  if ((zEllips._4_4_ == 0) && (sFinder.zDoc._4_4_ < local_118)) {
                    nBestScore = aSeen._4_4_;
                    nColSize = *(int *)(sFinder._8_8_ + (long)local_11c * 4);
                    sFinder.zDoc._0_4_ = ip;
                    sFinder.zDoc._4_4_ = local_118;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (zEllips._4_4_ == 0) {
      zEllips._4_4_ = (*pApi->xColumnText)(pFts,nBestScore,&ctx.zClose,(int *)&ctx.zIn);
    }
    if ((zEllips._4_4_ == 0) && ((int)sFinder.zDoc == 0)) {
      zEllips._4_4_ = (*pApi->xColumnSize)(pFts,nBestScore,(int *)&sFinder.zDoc);
    }
    if (ctx.zClose != (char *)0x0) {
      if (zEllips._4_4_ == 0) {
        zEllips._4_4_ = fts5CInstIterInit(pApi,pFts,nBestScore,(CInstIter *)&iCol);
      }
      ctx.iter._36_4_ = nColSize;
      ctx.iPos = nColSize + i + -1;
      if (0 < nColSize) {
        fts5HighlightAppend((int *)((long)&zEllips + 4),(HighlightContext *)&iCol,_nInst,-1);
      }
      while( true ) {
        bVar2 = false;
        if ((-1 < ctx.iter.iInst) && (bVar2 = false, ctx.iter.iInst < nColSize)) {
          bVar2 = zEllips._4_4_ == 0;
        }
        if (!bVar2) break;
        zEllips._4_4_ = fts5CInstIterNext((CInstIter *)&iCol);
      }
      if (zEllips._4_4_ == 0) {
        zEllips._4_4_ = (*pApi->xTokenize)(pFts,ctx.zClose,(int)ctx.zIn,&iCol,fts5HighlightCb);
      }
      if (ctx.iPos < (int)sFinder.zDoc + -1) {
        fts5HighlightAppend((int *)((long)&zEllips + 4),(HighlightContext *)&iCol,_nInst,-1);
      }
      else {
        fts5HighlightAppend((int *)((long)&zEllips + 4),(HighlightContext *)&iCol,
                            ctx.zClose + ctx.zIn._4_4_,(int)ctx.zIn - ctx.zIn._4_4_);
      }
    }
    if (zEllips._4_4_ == 0) {
      sqlite3_result_text(pCtx,(char *)ctx._80_8_,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_error_code(pCtx,zEllips._4_4_);
    }
    sqlite3_free((void *)ctx._80_8_);
    sqlite3_free(aSeen_00);
    sqlite3_free((void *)sFinder._8_8_);
  }
  else {
    _nDocsize = "wrong number of arguments to function snippet()";
    sqlite3_result_error(pCtx,"wrong number of arguments to function snippet()",-1);
  }
  return;
}

Assistant:

static void fts5SnippetFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc = SQLITE_OK;             /* Return code */
  int iCol;                       /* 1st argument to snippet() */
  const char *zEllips;            /* 4th argument to snippet() */
  int nToken;                     /* 5th argument to snippet() */
  int nInst = 0;                  /* Number of instance matches this row */
  int i;                          /* Used to iterate through instances */
  int nPhrase;                    /* Number of phrases in query */
  unsigned char *aSeen;           /* Array of "seen instance" flags */
  int iBestCol;                   /* Column containing best snippet */
  int iBestStart = 0;             /* First token of best snippet */
  int nBestScore = 0;             /* Score of best snippet */
  int nColSize = 0;               /* Total size of iBestCol in tokens */
  Fts5SFinder sFinder;            /* Used to find the beginnings of sentences */
  int nCol;

  if( nVal!=5 ){
    const char *zErr = "wrong number of arguments to function snippet()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  nCol = pApi->xColumnCount(pFts);
  memset(&ctx, 0, sizeof(HighlightContext));
  iCol = sqlite3_value_int(apVal[0]);
  ctx.zOpen = fts5ValueToText(apVal[1]);
  ctx.zClose = fts5ValueToText(apVal[2]);
  zEllips = fts5ValueToText(apVal[3]);
  nToken = sqlite3_value_int(apVal[4]);

  iBestCol = (iCol>=0 ? iCol : 0);
  nPhrase = pApi->xPhraseCount(pFts);
  aSeen = sqlite3_malloc(nPhrase);
  if( aSeen==0 ){
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    rc = pApi->xInstCount(pFts, &nInst);
  }

  memset(&sFinder, 0, sizeof(Fts5SFinder));
  for(i=0; i<nCol; i++){
    if( iCol<0 || iCol==i ){
      int nDoc;
      int nDocsize;
      int ii;
      sFinder.iPos = 0;
      sFinder.nFirst = 0;
      rc = pApi->xColumnText(pFts, i, &sFinder.zDoc, &nDoc);
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xTokenize(pFts, 
          sFinder.zDoc, nDoc, (void*)&sFinder,fts5SentenceFinderCb
      );
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xColumnSize(pFts, i, &nDocsize);
      if( rc!=SQLITE_OK ) break;

      for(ii=0; rc==SQLITE_OK && ii<nInst; ii++){
        int ip, ic, io;
        int iAdj;
        int nScore;
        int jj;

        rc = pApi->xInst(pFts, ii, &ip, &ic, &io);
        if( ic!=i ) continue;
        if( io>nDocsize ) rc = FTS5_CORRUPT;
        if( rc!=SQLITE_OK ) continue;
        memset(aSeen, 0, nPhrase);
        rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i,
            io, nToken, &nScore, &iAdj
        );
        if( rc==SQLITE_OK && nScore>nBestScore ){
          nBestScore = nScore;
          iBestCol = i;
          iBestStart = iAdj;
          nColSize = nDocsize;
        }

        if( rc==SQLITE_OK && sFinder.nFirst && nDocsize>nToken ){
          for(jj=0; jj<(sFinder.nFirst-1); jj++){
            if( sFinder.aFirst[jj+1]>io ) break;
          }

          if( sFinder.aFirst[jj]<io ){
            memset(aSeen, 0, nPhrase);
            rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i, 
              sFinder.aFirst[jj], nToken, &nScore, 0
            );

            nScore += (sFinder.aFirst[jj]==0 ? 120 : 100);
            if( rc==SQLITE_OK && nScore>nBestScore ){
              nBestScore = nScore;
              iBestCol = i;
              iBestStart = sFinder.aFirst[jj];
              nColSize = nDocsize;
            }
          }
        }
      }
    }
  }

  if( rc==SQLITE_OK ){
    rc = pApi->xColumnText(pFts, iBestCol, &ctx.zIn, &ctx.nIn);
  }
  if( rc==SQLITE_OK && nColSize==0 ){
    rc = pApi->xColumnSize(pFts, iBestCol, &nColSize);
  }
  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iBestCol, &ctx.iter);
    }

    ctx.iRangeStart = iBestStart;
    ctx.iRangeEnd = iBestStart + nToken - 1;

    if( iBestStart>0 ){
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }

    /* Advance iterator ctx.iter so that it points to the first coalesced
    ** phrase instance at or following position iBestStart. */
    while( ctx.iter.iStart>=0 && ctx.iter.iStart<iBestStart && rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    if( ctx.iRangeEnd>=(nColSize-1) ){
      fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);
    }else{
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }
  }
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(aSeen);
  sqlite3_free(sFinder.aFirst);
}